

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxForLoop::FxForLoop
          (FxForLoop *this,FxExpression *init,FxExpression *condition,FxExpression *iteration,
          FxExpression *code,FScriptPosition *pos)

{
  (this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition
            (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,pos);
  (this->super_FxLoopStatement).super_FxExpression.isresolved = false;
  (this->super_FxLoopStatement).super_FxExpression.NeedResult = true;
  (this->super_FxLoopStatement).super_FxExpression.ExprType = EFX_ForLoop;
  (this->super_FxLoopStatement).Jumps.Array = (FxJumpStatement **)0x0;
  (this->super_FxLoopStatement).Jumps.Most = 0;
  (this->super_FxLoopStatement).Jumps.Count = 0;
  (this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression =
       (_func_int **)&PTR__FxForLoop_0070cfc0;
  this->Init = init;
  this->Condition = condition;
  this->Iteration = iteration;
  this->Code = code;
  (this->super_FxLoopStatement).super_FxExpression.ValueType = &TypeVoid->super_PType;
  if (iteration != (FxExpression *)0x0) {
    iteration->NeedResult = false;
  }
  if (code != (FxExpression *)0x0) {
    code->NeedResult = false;
  }
  return;
}

Assistant:

FxForLoop::FxForLoop(FxExpression *init, FxExpression *condition, FxExpression *iteration, FxExpression *code, const FScriptPosition &pos)
: FxLoopStatement(EFX_ForLoop, pos), Init(init), Condition(condition), Iteration(iteration), Code(code)
{
	ValueType = TypeVoid;
	if (Iteration != nullptr) Iteration->NeedResult = false;
	if (Code != nullptr) Code->NeedResult = false;
}